

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O1

CMimeMessage_T * cmime_message_new(void)

{
  int iVar1;
  CMimeMessage_T *__ptr;
  CMimeStringList_T *pCVar2;
  
  __ptr = (CMimeMessage_T *)calloc(1,0x40);
  iVar1 = cmime_list_new(&__ptr->headers,_cmime_internal_header_destroy);
  if (iVar1 == 0) {
    __ptr->sender = (CMimeAddress_T *)0x0;
    iVar1 = cmime_list_new(&__ptr->recipients,_recipients_destroy);
    if (iVar1 == 0) {
      __ptr->linebreak = (char *)0x0;
      __ptr->boundary = (char *)0x0;
      __ptr->gap = (char *)0x0;
      iVar1 = cmime_list_new(&__ptr->parts,_cmime_internal_parts_destroy);
      if (iVar1 == 0) {
        pCVar2 = cmime_string_list_new();
        __ptr->boundaries = pCVar2;
        return __ptr;
      }
    }
  }
  free(__ptr);
  return (CMimeMessage_T *)0x0;
}

Assistant:

CMimeMessage_T *cmime_message_new(void) {
    CMimeMessage_T *message = NULL;
    
    message = (CMimeMessage_T *)calloc((size_t)1, sizeof(CMimeMessage_T));

    if (cmime_list_new(&message->headers,_cmime_internal_header_destroy)!=0) {
        free(message);
        return(NULL);
    }
    
    message->sender = NULL;
    if (cmime_list_new(&message->recipients,_recipients_destroy)!=0) {
        free(message);
        return(NULL);
    }

    message->boundary = NULL;
    message->gap = NULL;
    message->linebreak = NULL;

    if (cmime_list_new(&message->parts,_cmime_internal_parts_destroy)!=0)  {
        free(message);
        return(NULL);
    }


    message->boundaries = cmime_string_list_new();
    return(message);
}